

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_object___getClass(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int iVar1;
  int iVar2;
  JSContext *in_RDI;
  JSValue *in_R8;
  JSValue JVar3;
  int class_id;
  uint32_t tag;
  JSObject *p;
  JSAtom atom;
  JSAtom in_stack_ffffffffffffffac;
  uint in_stack_ffffffffffffffb0;
  
  iVar1 = (int)in_R8->tag;
  if (((iVar1 == -1) &&
      (in_stack_ffffffffffffffb0 = (uint)*(ushort *)((long)(in_R8->u).ptr + 6),
      in_stack_ffffffffffffffb0 == 0x29)) && (iVar2 = JS_IsFunction(in_RDI,*in_R8), iVar2 != 0)) {
    in_stack_ffffffffffffffb0 = 0xd;
  }
  JVar3 = JS_AtomToString((JSContext *)CONCAT44(iVar1,in_stack_ffffffffffffffb0),
                          in_stack_ffffffffffffffac);
  return JVar3;
}

Assistant:

static JSValue js_object___getClass(JSContext *ctx, JSValueConst this_val,
                                    int argc, JSValueConst *argv)
{
    JSAtom atom;
    JSObject *p;
    uint32_t tag;
    int class_id;

    tag = JS_VALUE_GET_NORM_TAG(argv[0]);
    if (tag == JS_TAG_OBJECT) {
        p = JS_VALUE_GET_OBJ(argv[0]);
        class_id = p->class_id;
        if (class_id == JS_CLASS_PROXY && JS_IsFunction(ctx, argv[0]))
            class_id = JS_CLASS_BYTECODE_FUNCTION;
        atom = ctx->rt->class_array[class_id].class_name;
    } else {
        atom = JS_ATOM_empty_string;
    }
    return JS_AtomToString(ctx, atom);
}